

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFStream.cpp
# Opt level: O0

void __thiscall
adios2::transport::FileFStream::Read(FileFStream *this,char *buffer,size_t size,size_t start)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  long in_RCX;
  ulong in_RDX;
  long in_RDI;
  size_t b;
  size_t position;
  size_t remainder;
  size_t batches;
  anon_class_8_1_8991fb9c lf_Read;
  streamoff in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ulong local_108;
  unsigned_long in_stack_ffffffffffffff18;
  string local_d8 [8];
  FileFStream *in_stack_ffffffffffffff30;
  string local_b8 [32];
  string local_98 [16];
  string *in_stack_ffffffffffffff78;
  FileFStream *in_stack_ffffffffffffff80;
  string local_78 [24];
  size_t in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffffb0;
  undefined8 local_38;
  undefined8 local_30;
  
  WaitForOpen(in_stack_ffffffffffffff30);
  if (in_RCX != -1) {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0xf0);
    std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)__rhs,in_stack_fffffffffffffed8);
    std::istream::seekg(__rhs,local_38,local_30);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8;
    std::__cxx11::to_string(in_stack_ffffffffffffff18);
    std::operator+((char *)__lhs,__rhs);
    std::operator+(__lhs,(char *)__rhs);
    std::operator+(__lhs,__rhs);
    std::operator+(__lhs,(char *)__rhs);
    CheckFile(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_d8);
  }
  if (in_RDX < 0x7ffe7001) {
    Read::anon_class_8_1_8991fb9c::operator()
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  }
  else {
    for (local_108 = 0; local_108 < in_RDX / 0x7ffe7000; local_108 = local_108 + 1) {
      Read::anon_class_8_1_8991fb9c::operator()
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    }
    Read::anon_class_8_1_8991fb9c::operator()
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  }
  return;
}

Assistant:

void FileFStream::Read(char *buffer, size_t size, size_t start)
{
    auto lf_Read = [&](char *buffer, size_t size) {
        ProfilerStart("read");
        m_FileStream.read(buffer, static_cast<std::streamsize>(size));
        ProfilerStop("read");
        CheckFile("couldn't read from file " + m_Name + ", in call to fstream read");
    };

    WaitForOpen();
    if (start != MaxSizeT)
    {
        m_FileStream.seekg(start);
        CheckFile("couldn't move to start position " + std::to_string(start) + " in file " +
                  m_Name + ", in call to fstream seekg");
    }

    if (size > DefaultMaxFileBatchSize)
    {
        const size_t batches = size / DefaultMaxFileBatchSize;
        const size_t remainder = size % DefaultMaxFileBatchSize;

        size_t position = 0;
        for (size_t b = 0; b < batches; ++b)
        {
            lf_Read(&buffer[position], DefaultMaxFileBatchSize);
            position += DefaultMaxFileBatchSize;
        }
        lf_Read(&buffer[position], remainder);
    }
    else
    {
        lf_Read(buffer, size);
    }
}